

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cc
# Opt level: O2

void __thiscall gimage::View::setDepthImage(View *this,ImageFloat *d)

{
  Camera *pCVar1;
  long lVar2;
  
  Image<float,_gimage::PixelTraits<float>_>::operator=(&this->depth,d);
  pCVar1 = this->camera;
  if (((pCVar1 != (Camera *)0x0) && (pCVar1->width == 0)) && (pCVar1->height == 0)) {
    lVar2 = (this->depth).height;
    pCVar1->width = (this->depth).width;
    pCVar1->height = lVar2;
  }
  return;
}

Assistant:

void View::setDepthImage(const ImageFloat &d)
{
  // make sure that the size of the camera is the same as the size of the
  // images

  if (camera != 0 && camera->getWidth() > 0 && camera->getHeight() > 0)
  {
    assert(camera->getWidth() == d.getWidth());
    assert(camera->getHeight() == d.getHeight());
  }

  if (image.getWidth() > 0 && image.getHeight() > 0)
  {
    assert(d.getWidth() == image.getWidth());
    assert(d.getHeight() == image.getHeight());
  }

  depth=d;

  // set size of camera from images if neccessary

  if (camera != 0 && camera->getWidth() == 0 && camera->getHeight() == 0)
  {
    camera->setSize(depth.getWidth(), depth.getHeight());
  }
}